

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2Runner.hpp
# Opt level: O2

int __thiscall Centaurus::Stage2Runner::parse_subtree(Stage2Runner *this,uint64_t *ast,int position)

{
  ulong uVar1;
  pointer puVar2;
  atomic<int> *paVar3;
  long lVar4;
  uint64_t uVar5;
  SimpleException *this_00;
  int k;
  int position_00;
  uint64_t *puVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  allocator local_81;
  uint64_t *local_80;
  Stage2Runner *local_78;
  long local_70;
  long local_68;
  uint64_t local_60;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_58;
  SymbolEntry sym;
  
  local_68 = (long)position;
  local_60 = ast[local_68];
  position_00 = position + 1;
  local_80 = (uint64_t *)CONCAT44(local_80._4_4_,position_00);
  iVar8 = position_00;
  local_78 = this;
  while( true ) {
    uVar7 = (ulong)position_00;
    if ((this->super_BaseRunner).m_bank_size >> 3 <= uVar7) {
      return position_00;
    }
    uVar1 = ast[uVar7];
    if (uVar1 == 0) break;
    lVar9 = (long)iVar8;
    if ((uVar1 & 0x7fff000000000000) == 0 || -1 < (long)uVar1) {
      if (0xffffffffffff < (long)uVar1) {
        puVar2 = (this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar2) {
          (this->val_stack).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar2;
        }
        local_58 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->val_stack;
        lVar4 = (long)(int)local_80;
        puVar6 = ast + lVar4 + 1;
        local_80 = ast;
        local_70 = lVar4;
        for (; lVar4 < lVar9; lVar4 = lVar4 + 2) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                    (local_58,puVar6);
          puVar6 = puVar6 + 2;
          this = local_78;
        }
        sym.id = uVar1 >> 0x30;
        sym.start = local_60 & 0xffffffffffff;
        if (this->m_listener == (ReductionListener)0x0) {
          uVar5 = 0;
        }
        else {
          puVar6 = (this->val_stack).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sym.end = uVar1 & 0xffffffffffff;
          uVar5 = (*this->m_listener)(&sym,puVar6,
                                      (int)((ulong)((long)(this->val_stack).
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)puVar6) >> 3),this->m_listener_context);
          this = local_78;
        }
        paVar3 = this->reduction_counter;
        lVar4 = local_70;
        if (paVar3 != (atomic<int> *)0x0) {
          LOCK();
          *(int *)paVar3 = *(int *)paVar3 + 1;
          UNLOCK();
        }
        for (; lVar4 < lVar9; lVar4 = lVar4 + 1) {
          local_80[lVar4] = 0;
        }
        local_80[uVar7] = 0;
        local_80[local_68] = uVar1 & 0xffffffffffff | 0x8000000000000000;
        local_80[local_70] = uVar5;
        return position_00;
      }
    }
    else {
      position_00 = parse_subtree(local_78,ast,position_00);
      this = local_78;
      if ((ulong)(long)position_00 < (local_78->super_BaseRunner).m_bank_size >> 3) {
        uVar5 = ast[uVar7];
        ast[uVar7] = 0;
        ast[lVar9] = uVar5;
        uVar5 = ast[uVar7 + 1];
        ast[uVar7 + 1] = 0;
        ast[lVar9 + 1] = uVar5;
        iVar8 = iVar8 + 2;
      }
    }
    position_00 = position_00 + 1;
  }
  this_00 = (SimpleException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&sym,"Null entry in CST window.",&local_81);
  SimpleException::SimpleException(this_00,(string *)&sym);
  __cxa_throw(this_00,&SimpleException::typeinfo,SimpleException::~SimpleException);
}

Assistant:

int parse_subtree(uint64_t *ast, int position)
  {
    CSTMarker start_marker(ast[position]);
    int i, j;
    j = position + 1;
    for (i = position + 1; i < m_bank_size / 8; i++) {
      if (ast[i] == 0) {
        throw SimpleException("Null entry in CST window.");
      }
      CSTMarker marker(ast[i]);
      if (marker.is_start_marker()) {
        int k = parse_subtree(ast, i);
        if (k < m_bank_size / 8) {
          uint64_t subtree_sv[2];
          subtree_sv[0] = ast[i];
          ast[i] = 0;
          ast[j] = subtree_sv[0];
          subtree_sv[1] = ast[i + 1];
          ast[i + 1] = 0;
          ast[j + 1] = subtree_sv[1];
          j += 2;
        }
        i = k;
      } else if (marker.is_end_marker()) {
        val_stack.clear();
        for (int l = position + 1; l < j; l += 2) {
          val_stack.emplace_back(ast[l + 1]);
        }
        long tag = 0;
        SymbolEntry sym(marker.get_machine_id(), start_marker.get_offset(), marker.get_offset());
        if (m_listener != nullptr)
          tag = m_listener(&sym, val_stack.data(), val_stack.size(), m_listener_context);
        if (reduction_counter != nullptr) {
          (*reduction_counter)++;
        }
        //Zero-fill the SV list
        for (int k = position + 1; k < j; k++) {
          ast[k] = 0;
        }
        //Zero-fill the end marker
        ast[i] = 0;
        ast[position] = ((uint64_t)1 << 63) | marker.get_offset();
        ast[position + 1] = tag;
        return i;
      }
    }
    return i;
  }